

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutation_iterator.h
# Opt level: O2

void __thiscall
Gudhi::coxeter_triangulation::Permutation_iterator::elementary_increment_optim_3
          (Permutation_iterator *this)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  if (this->ct_ != 0) {
    uVar4 = this->ct_ - 1;
    this->ct_ = uVar4;
    uVar5 = (ulong)(uVar4 & 1);
    puVar1 = (this->value_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = puVar1[uVar5 + 1];
    puVar1[uVar5 + 1] = *puVar1;
    *puVar1 = uVar4;
    return;
  }
  this->ct_ = 5;
  puVar1 = (this->d_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 2;
  while( true ) {
    uVar4 = puVar1[uVar5];
    uVar6 = (int)uVar5 + 1;
    if (uVar4 != uVar6) break;
    puVar1[uVar5] = 0;
    uVar5 = (ulong)uVar4;
  }
  if ((int)uVar5 == this->n_ - 1) {
    this->is_end_ = true;
    return;
  }
  uVar3 = 0;
  if ((uVar5 & 1) == 0) {
    uVar3 = uVar4;
  }
  puVar2 = (this->value_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = puVar2[uVar6];
  puVar2[uVar6] = puVar2[uVar3];
  puVar2[uVar3] = uVar4;
  puVar1[uVar5] = puVar1[uVar5] + 1;
  return;
}

Assistant:

void elementary_increment_optim_3() {
    if (ct_ != 0) {
      --ct_;
      swap_two_indices(1 + (ct_ % 2), 0);
    } else {
      ct_ = 5;
      uint j = 2;
      while (d_[j] == j + 1) {
        d_[j] = 0;
        ++j;
      }
      if (j == n_ - 1) {
        is_end_ = true;
        return;
      }
      uint k = j + 1;
      uint x = (k % 2 ? d_[j] : 0);
      swap_two_indices(k, x);
      ++d_[j];
    }
  }